

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

DFA * __thiscall re2::DFA::DumpWorkq_abi_cxx11_(DFA *this,Workq *q)

{
  bool bVar1;
  uint *puVar2;
  uint *local_30;
  iterator it;
  char *sep;
  Workq *q_local;
  string *s;
  
  std::__cxx11::string::string((string *)this);
  it = (iterator)0x1a1246;
  for (local_30 = (uint *)SparseSet::begin(&q->super_SparseSet);
      puVar2 = (uint *)SparseSet::end(&q->super_SparseSet), local_30 != puVar2;
      local_30 = local_30 + 1) {
    bVar1 = Workq::is_mark(q,*local_30);
    if (bVar1) {
      StringAppendF((string *)this,"|");
      it = (iterator)0x1a1246;
    }
    else {
      StringAppendF((string *)this,"%s%d",it,(ulong)*local_30);
      it = (iterator)anon_var_dwarf_24840;
    }
  }
  return this;
}

Assistant:

string DFA::DumpWorkq(Workq* q) {
  string s;
  const char* sep = "";
  for (DFA::Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      StringAppendF(&s, "|");
      sep = "";
    } else {
      StringAppendF(&s, "%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}